

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O3

Gia_Man_t * Gia_ManMapShrink6(Gia_Man_t *p,int nFanoutMax,int fKeepLevel,int fVerbose)

{
  Shr_Fan_t *pSVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Shr_Man_t *p_00;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int Fill;
  int Fill_00;
  long lVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  word *pwVar22;
  int iVar23;
  ulong uVar24;
  timespec ts;
  word uTruth1;
  word uTruth0;
  uint local_a8;
  uint local_a4;
  ulong local_88;
  timespec local_78;
  int local_68;
  int local_64;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  word local_40;
  ulong local_38;
  
  local_68 = fVerbose;
  iVar4 = clock_gettime(3,&local_78);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                  ,0x19a,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
  }
  p_00 = Shr_ManAlloc(p);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  local_a4 = 0;
  local_a8 = 0;
  if (1 < p->nObjs) {
    lVar14 = 1;
    local_a8 = 0;
    local_a4 = 0;
    do {
      pGVar3 = p->pObjs + lVar14;
      uVar11 = (uint)*(ulong *)pGVar3;
      if ((uVar11 & 0x9fffffff) == 0x9fffffff) {
        pGVar9 = p_00->pNew;
        pGVar5 = Gia_ManAppendObj(pGVar9);
        uVar6 = *(ulong *)pGVar5;
        *(ulong *)pGVar5 = uVar6 | 0x9fffffff;
        *(ulong *)pGVar5 =
             uVar6 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar9->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pGVar9->pObjs;
        if ((pGVar5 < pGVar2) || (pGVar2 + pGVar9->nObjs <= pGVar5)) {
LAB_007d0804:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pGVar9->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pGVar9->pObjs;
        if ((pGVar5 < pGVar2) || (pGVar2 + pGVar9->nObjs <= pGVar5)) goto LAB_007d0804;
        iVar4 = (int)((long)pGVar5 - (long)pGVar2 >> 2);
        uVar11 = iVar4 * -0x55555555;
        uVar17 = iVar4 * 0x55555556;
        pGVar3->Value = uVar17;
        pVVar7 = p->vLevels;
        if (pVVar7 != (Vec_Int_t *)0x0) {
          if ((int)uVar17 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pGVar9 = p_00->pNew;
          if (pGVar9->nObjs <= (int)(uVar11 & 0x7fffffff)) {
LAB_007d0823:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar2 = p->pObjs;
          if ((pGVar3 < pGVar2) || (pGVar2 + p->nObjs <= pGVar3)) goto LAB_007d0804;
          pGVar5 = pGVar9->pObjs + (uVar11 & 0x7fffffff);
          uVar11 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
          Vec_IntFillExtra(pVVar7,uVar11 + 1,Fill);
          if (((int)uVar11 < 0) || (pVVar7->nSize <= (int)uVar11)) goto LAB_007d07e5;
          pGVar3 = pGVar9->pObjs;
          if ((pGVar5 < pGVar3) || (pGVar3 + pGVar9->nObjs <= pGVar5)) goto LAB_007d0804;
          iVar4 = pVVar7->pArray[uVar11 & 0x7fffffff];
          uVar11 = (int)((long)pGVar5 - (long)pGVar3 >> 2) * -0x55555555;
          pVVar7 = pGVar9->vLevels;
          Vec_IntFillExtra(pVVar7,uVar11 + 1,Fill_00);
          if (((int)uVar11 < 0) || (pVVar7->nSize <= (int)uVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar7->pArray[uVar11 & 0x7fffffff] = iVar4;
        }
      }
      else {
        uVar6 = *(ulong *)pGVar3 & 0x1fffffff;
        if (uVar6 == 0x1fffffff || -1 < (int)uVar11) {
          pVVar7 = p->vMapping;
          if (pVVar7->nSize <= lVar14) {
LAB_007d07e5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (pVVar7->pArray[lVar14] != 0) {
            p_00->vLeaves->nSize = 0;
            lVar12 = (long)pVVar7->nSize;
            if (lVar12 <= lVar14) goto LAB_007d07e5;
            lVar18 = 0;
            while( true ) {
              piVar16 = pVVar7->pArray;
              lVar15 = (long)piVar16[lVar14];
              if ((lVar15 < 0) || ((uint)lVar12 <= (uint)piVar16[lVar14])) goto LAB_007d07e5;
              if (piVar16[lVar15] <= lVar18) break;
              Vec_IntPush(p_00->vLeaves,piVar16[lVar15 + lVar18 + 1]);
              lVar18 = lVar18 + 1;
              pVVar7 = p->vMapping;
              lVar12 = (long)pVVar7->nSize;
              if (lVar12 <= lVar14) goto LAB_007d07e5;
            }
            if (6 < p_00->vLeaves->nSize) {
              __assert_fail("Vec_IntSize(pMan->vLeaves) <= 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                            ,0x1b0,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
            }
            local_88 = Shr_ManComputeTruth6(p_00->pGia,pGVar3,p_00->vLeaves,p_00->vTruths);
            if (pGVar3->Value != 0xffffffff) {
              __assert_fail("pObj->Value == ~0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                            ,0x1b3,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
            }
            if (local_88 + 1 < 2) {
              pGVar3->Value = (uint)(local_88 == 0xffffffffffffffff);
            }
            else {
              pVVar7 = p_00->vLeaves;
              iVar4 = pVVar7->nSize;
              if (0 < (long)iVar4) {
                piVar16 = pVVar7->pArray;
                uVar11 = 0xffffffff;
                lVar12 = 0;
                do {
                  iVar23 = *piVar16;
                  if (((long)iVar23 < 0) || (p->nObjs <= iVar23)) goto LAB_007d0823;
                  if (p->pObjs == (Gia_Obj_t *)0x0) break;
                  uVar6 = *(ulong *)((long)Truth + lVar12) ^ local_88;
                  if (local_88 == *(ulong *)((long)Truth + lVar12) || uVar6 == 0xffffffffffffffff) {
                    uVar11 = p->pObjs[iVar23].Value;
                    if ((int)uVar11 < 0) goto LAB_007d08fc;
                    uVar11 = uVar11 ^ uVar6 == 0xffffffffffffffff;
                    pGVar3->Value = uVar11;
                  }
                  piVar16 = piVar16 + 1;
                  lVar12 = lVar12 + 8;
                } while ((long)iVar4 * 8 - lVar12 != 0);
                if (uVar11 != 0xffffffff) goto LAB_007d00b4;
                if (0 < iVar4) {
                  piVar16 = pVVar7->pArray;
                  pwVar22 = Truth;
                  lVar12 = 0;
                  do {
                    iVar4 = piVar16[lVar12];
                    if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007d0823;
                    if (p->pObjs == (Gia_Obj_t *)0x0) break;
                    uVar11 = p->pObjs[iVar4].Value;
                    if ((int)uVar11 < 0) {
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                    ,0x130,"int Abc_LitIsCompl(int)");
                    }
                    if ((uVar11 & 1) != 0) {
                      bVar10 = (byte)(1 << ((byte)lVar12 & 0x1f));
                      local_88 = (~*pwVar22 & local_88) << (bVar10 & 0x3f) |
                                 (*pwVar22 & local_88) >> (bVar10 & 0x3f);
                    }
                    piVar16[lVar12] = uVar11 >> 1;
                    lVar12 = lVar12 + 1;
                    pwVar22 = pwVar22 + 1;
                  } while (lVar12 < pVVar7->nSize);
                }
              }
              clock_gettime(3,&local_78);
              iVar4 = p_00->nDivMax;
              if (iVar4 < 7) {
                __assert_fail("Limit > 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                              ,0xe3,"int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                             );
              }
              pVVar7 = p_00->vLeaves;
              p_00->vDivs->nSize = 0;
              p_00->vPrio->nSize = 0;
              Gia_ManIncrementTravId(p_00->pNew);
              if (0 < pVVar7->nSize) {
                lVar12 = 0;
                do {
                  iVar23 = pVVar7->pArray[lVar12];
                  Vec_IntPush(p_00->vDivs,iVar23);
                  Shr_ManDivPushOrderByLevel(p_00,iVar23);
                  pGVar9 = p_00->pNew;
                  if (pGVar9->nTravIdsAlloc <= iVar23) {
LAB_007d08be:
                    __assert_fail("Id < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
                  }
                  pGVar9->pTravIds[iVar23] = pGVar9->nTravIds;
                  lVar12 = lVar12 + 1;
                } while (lVar12 < pVVar7->nSize);
              }
              pVVar7 = p_00->vPrio;
              if (0 < pVVar7->nSize) {
                lVar12 = 0;
                do {
                  uVar11 = pVVar7->pArray[lVar12];
                  uVar6 = (ulong)uVar11;
                  pGVar9 = p_00->pNew;
                  if (pGVar9->nTravIdsAlloc <= (int)uVar11) {
LAB_007d0861:
                    __assert_fail("Id < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
                  }
                  if (pGVar9->pTravIds[(int)uVar11] != pGVar9->nTravIds) {
                    __assert_fail("Gia_ObjIsTravIdCurrentId(p->pNew, iDiv)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                                  ,0xf0,
                                  "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)");
                  }
                  local_58 = lVar12;
                  if (((int)uVar11 < 0) || (p_00->vObj2Fan->nSize <= (int)uVar11))
                  goto LAB_007d07e5;
                  uVar17 = p_00->vObj2Fan->pArray[uVar6];
                  if ((ulong)uVar17 != 0) {
                    if (((int)uVar17 < 0) || (p_00->vFanMem->nSize <= (int)uVar17)) {
LAB_007d0842:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                    }
                    pSVar1 = (Shr_Fan_t *)(p_00->vFanMem->pArray + uVar17);
                    p_00->pFanTemp = pSVar1;
                    uVar17 = pSVar1->iFan;
                    if (uVar17 != 0) {
                      local_64 = uVar11 + 1;
                      iVar23 = nFanoutMax + 1;
                      local_50 = uVar6;
                      do {
                        iVar23 = iVar23 + -1;
                        if (iVar23 == 0) break;
                        pGVar9 = p_00->pNew;
                        if (pGVar9->nTravIdsAlloc <= (int)uVar17) goto LAB_007d0861;
                        lVar12 = (long)(int)uVar17;
                        if (pGVar9->pTravIds[lVar12] != pGVar9->nTravIds) {
                          local_48 = lVar12;
                          if (((int)uVar17 < 0) || (pGVar9->nObjs <= (int)uVar17))
                          goto LAB_007d0823;
                          pGVar2 = pGVar9->pObjs;
                          uVar11 = (uint)*(undefined8 *)(pGVar2 + uVar17);
                          if (((int)uVar11 < 0) ||
                             (uVar11 = uVar11 & 0x1fffffff, uVar11 == 0x1fffffff)) {
                            __assert_fail("Gia_ObjIsAnd(pFan)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                                          ,0xf8,
                                          "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          if (pGVar9->nObjs <= (int)uVar6) goto LAB_007d0823;
                          pVVar7 = pGVar9->vLevels;
                          Vec_IntFillExtra(pVVar7,local_64,uVar11);
                          if (pVVar7->nSize <= (int)uVar6) goto LAB_007d07e5;
                          pGVar2 = pGVar2 + uVar17;
                          pGVar9 = p_00->pNew;
                          pGVar5 = pGVar9->pObjs;
                          if ((pGVar2 < pGVar5) || (pGVar5 + pGVar9->nObjs <= pGVar2))
                          goto LAB_007d0804;
                          iVar20 = pVVar7->pArray[uVar6];
                          uVar11 = (int)((long)pGVar2 - (long)pGVar5 >> 2) * -0x55555555;
                          pVVar8 = pGVar9->vLevels;
                          Vec_IntFillExtra(pVVar8,uVar11 + 1,(int)pVVar7->pArray);
                          lVar12 = local_48;
                          if (((int)uVar11 < 0) || (pVVar8->nSize <= (int)uVar11))
                          goto LAB_007d07e5;
                          if (pVVar8->pArray[uVar11 & 0x7fffffff] <= iVar20) {
                            __assert_fail("Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, iDiv)) < Gia_ObjLevel(p->pNew, pFan)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                                          ,0xf9,
                                          "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          pGVar9 = p_00->pNew;
                          iVar20 = uVar17 - ((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
                          if (pGVar9->nTravIdsAlloc <= iVar20) goto LAB_007d0861;
                          iVar20 = pGVar9->pTravIds[iVar20];
                          uVar6 = local_50;
                          if (iVar20 == pGVar9->nTravIds) {
                            iVar21 = uVar17 - ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) &
                                              0x1fffffff);
                            if (pGVar9->nTravIdsAlloc <= iVar21) goto LAB_007d0861;
                            if (pGVar9->pTravIds[iVar21] == iVar20) {
                              Vec_IntPush(p_00->vDivs,uVar17);
                              pGVar9 = p_00->pNew;
                              if (pGVar9->nTravIdsAlloc <= (int)uVar17) goto LAB_007d08be;
                              pGVar9->pTravIds[lVar12] = pGVar9->nTravIds;
                              iVar20 = Shr_ManDivPushOrderByLevel(p_00,uVar17);
                              if (iVar20 <= local_58) {
                                __assert_fail("i < iPlace",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                                              ,0x100,
                                              "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                             );
                              }
                              uVar6 = local_50;
                              if (p_00->vDivs->nSize == iVar4) goto LAB_007d05e7;
                            }
                          }
                        }
                        uVar11 = p_00->pFanTemp->Next;
                        if ((ulong)uVar11 == 0) break;
                        if (((int)uVar11 < 0) || (p_00->vFanMem->nSize <= (int)uVar11))
                        goto LAB_007d0842;
                        pSVar1 = (Shr_Fan_t *)(p_00->vFanMem->pArray + uVar11);
                        p_00->pFanTemp = pSVar1;
                        uVar17 = pSVar1->iFan;
                      } while (uVar17 != 0);
                      pVVar7 = p_00->vPrio;
                    }
                  }
                  lVar12 = local_58 + 1;
                } while (lVar12 < pVVar7->nSize);
              }
              iVar4 = p_00->vDivs->nSize;
LAB_007d05e7:
              if (p_00->nDivMax < iVar4) {
                __assert_fail("nDivs <= pMan->nDivMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaShrink6.c"
                              ,0x1c6,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
              }
              clock_gettime(3,&local_78);
              Shr_ManComputeTruths
                        (p_00->pNew,p_00->vLeaves->nSize,p_00->vDivs,p_00->vDivTruths,p_00->vTruths)
              ;
              iVar4 = Rsb_ManPerformResub6
                                (p_00->pManRsb,p_00->vLeaves->nSize,local_88,p_00->vDivTruths,
                                 &local_38,&local_40,0);
              if (iVar4 == 0) {
                uVar11 = Shr_ObjPerformBidec(p_00,p_00->pManDec,p_00->pNew,p_00->vLeaves,local_88,
                                             0xffffffffffffffff);
                pGVar3->Value = uVar11;
                local_a8 = local_a8 + 1;
              }
              else {
                pVVar8 = Rsb_ManGetFanins(p_00->pManRsb);
                pVVar7 = p_00->vDivResub;
                pVVar7->nSize = 0;
                if (0 < pVVar8->nSize) {
                  lVar12 = 0;
                  do {
                    iVar4 = pVVar8->pArray[lVar12];
                    if (((long)iVar4 < 0) || (p_00->vDivs->nSize <= iVar4)) goto LAB_007d07e5;
                    Vec_IntPush(p_00->vDivResub,p_00->vDivs->pArray[iVar4]);
                    lVar12 = lVar12 + 1;
                  } while (lVar12 < pVVar8->nSize);
                  pVVar7 = p_00->vDivResub;
                }
                uVar11 = Shr_ObjPerformBidec(p_00,p_00->pManDec,p_00->pNew,pVVar7,local_40,
                                             local_38 | local_40);
                pGVar3->Value = uVar11;
                local_a4 = local_a4 + 1;
              }
            }
          }
        }
        else {
          uVar17 = pGVar3[-uVar6].Value;
          if ((int)uVar17 < 0) {
LAB_007d08fc:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar9 = p_00->pNew;
          uVar19 = uVar17 >> 1;
          if (pGVar9->nObjs <= (int)uVar19) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(pGVar9->pObjs + uVar19) & 0x1fffffff) != 0 &&
              (int)*(uint *)(pGVar9->pObjs + uVar19) < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar5 = Gia_ManAppendObj(pGVar9);
          uVar6 = *(ulong *)pGVar5;
          *(ulong *)pGVar5 = uVar6 | 0x80000000;
          pGVar2 = pGVar9->pObjs;
          if ((pGVar5 < pGVar2) || (pGVar2 + pGVar9->nObjs <= pGVar5)) goto LAB_007d0804;
          uVar13 = (ulong)(((uint)((int)pGVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar19 &
                          0x1fffffff);
          uVar24 = (ulong)((uVar17 << 0x1d ^ uVar11) & 0x20000000);
          *(ulong *)pGVar5 = uVar24 | uVar6 & 0xffffffffc0000000 | 0x80000000 | uVar13;
          *(ulong *)pGVar5 =
               uVar24 | uVar6 & 0xe0000000c0000000 | 0x80000000 | uVar13 |
               (ulong)(pGVar9->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar2 = pGVar9->pObjs;
          if ((pGVar5 < pGVar2) || (pGVar2 + pGVar9->nObjs <= pGVar5)) goto LAB_007d0804;
          Vec_IntPush(pGVar9->vCos,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555);
          if (pGVar9->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pGVar9,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),
                             pGVar5);
          }
          pGVar2 = pGVar9->pObjs;
          if ((pGVar5 < pGVar2) || (pGVar2 + pGVar9->nObjs <= pGVar5)) goto LAB_007d0804;
          pGVar3->Value = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * 0x55555556;
        }
      }
LAB_007d00b4:
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nObjs);
  }
  if (local_68 != 0) {
    printf("Performed %d resubs and %d decomps.  ",(ulong)local_a4,(ulong)local_a8);
    iVar4 = 0xa55901;
    printf("Gain in AIG nodes = %d.  ",(ulong)(uint)(p->nObjs - p_00->pNew->nObjs));
    Abc_Print(iVar4,"%s =","Runtime");
    iVar23 = 3;
    iVar4 = clock_gettime(3,&local_78);
    if (iVar4 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar23,"%9.2f sec\n",(double)(lVar14 + local_60) / 1000000.0);
  }
  pGVar9 = Shr_ManFree(p_00);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManMapShrink6( Gia_Man_t * p, int nFanoutMax, int fKeepLevel, int fVerbose )
{
    Shr_Man_t * pMan;
    Gia_Obj_t * pObj, * pFanin;
    word uTruth, uTruth0, uTruth1;
    int i, k, nDivs, iNode;
    int RetValue, Counter1 = 0, Counter2 = 0;
    abctime clk2, clk = Abc_Clock();
    abctime timeFanout = 0;
    assert( Gia_ManHasMapping(p) );
    pMan = Shr_ManAlloc( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pMan->pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pMan->pNew, Gia_ObjFromLit(pMan->pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            // collect leaves of this gate  
            Vec_IntClear( pMan->vLeaves );
            Gia_LutForEachFanin( p, i, iNode, k )
                Vec_IntPush( pMan->vLeaves, iNode );
            assert( Vec_IntSize(pMan->vLeaves) <= 6 );
            // compute truth table 
            uTruth = Shr_ManComputeTruth6( pMan->pGia, pObj, pMan->vLeaves, pMan->vTruths );
            assert( pObj->Value == ~0 );
            if ( uTruth == 0 || ~uTruth == 0 )
                pObj->Value = Abc_LitNotCond( 0, ~uTruth == 0 );
            else
                Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
                    if ( uTruth == Truth[k] || ~uTruth == Truth[k] )
                        pObj->Value = Abc_LitNotCond( pFanin->Value, ~uTruth == Truth[k] );
            if ( pObj->Value != ~0 )
                continue;
            // translate into new nodes
            Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
            {
                if ( Abc_LitIsCompl(pFanin->Value) )
                    uTruth = ((uTruth & Truth[k]) >> (1 << k)) | ((uTruth & ~Truth[k]) << (1 << k));
                Vec_IntWriteEntry( pMan->vLeaves, k, Abc_Lit2Var(pFanin->Value) );
            }
            // compute divisors
            clk2 = Abc_Clock();
            nDivs = Shr_ManCollectDivisors( pMan, pMan->vLeaves, pMan->nDivMax, nFanoutMax );
            assert( nDivs <= pMan->nDivMax );
            timeFanout += Abc_Clock() - clk2;
            // compute truth tables
            Shr_ManComputeTruths( pMan->pNew, Vec_IntSize(pMan->vLeaves), pMan->vDivs, pMan->vDivTruths, pMan->vTruths );
            // perform resubstitution
            RetValue = Rsb_ManPerformResub6( pMan->pManRsb, Vec_IntSize(pMan->vLeaves), uTruth, pMan->vDivTruths, &uTruth0, &uTruth1, 0 );
            if ( RetValue ) // resub exists
            {
                Vec_Int_t * vResult = Rsb_ManGetFanins(pMan->pManRsb);
                Vec_IntClear( pMan->vDivResub );
                Vec_IntForEachEntry( vResult, iNode, k )
                    Vec_IntPush( pMan->vDivResub, Vec_IntEntry(pMan->vDivs, iNode) );
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vDivResub, uTruth1, uTruth0 | uTruth1 );
                Counter1++;
            }
            else
            {
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vLeaves, uTruth, ~(word)0 );
                Counter2++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "Performed %d resubs and %d decomps.  ", Counter1, Counter2 );
        printf( "Gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pMan->pNew) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
//        ABC_PRT( "Divisors", timeFanout );        
    }
    return Shr_ManFree( pMan );
}